

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Tags::Tag::ExpandSimpleTagsArray(Tag *this)

{
  SimpleTag *pSVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  SimpleTag *this_00;
  long *in_RDI;
  ulong uVar6;
  int idx;
  SimpleTag *displays;
  int size;
  SimpleTag *local_a0;
  SimpleTag *local_78;
  int local_6c;
  int local_60;
  bool local_1;
  
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    local_1 = true;
  }
  else {
    if ((int)in_RDI[1] == 0) {
      local_6c = 1;
    }
    else {
      local_6c = (int)in_RDI[1] << 1;
    }
    uVar3 = (ulong)local_6c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_78 = (SimpleTag *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_78 = (SimpleTag *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_a0 = local_78;
        do {
          SimpleTag::SimpleTag(local_a0);
          local_a0 = local_a0 + 1;
        } while (local_a0 != local_78 + uVar3);
      }
    }
    if (local_78 == (SimpleTag *)0x0) {
      local_1 = false;
    }
    else {
      for (local_60 = 0; local_60 < *(int *)((long)in_RDI + 0xc); local_60 = local_60 + 1) {
        SimpleTag::ShallowCopy((SimpleTag *)(*in_RDI + (long)local_60 * 0x10),local_78 + local_60);
      }
      pSVar1 = (SimpleTag *)*in_RDI;
      if (pSVar1 != (SimpleTag *)0x0) {
        this_00 = pSVar1 + (long)pSVar1[-1].m_tag_string;
        while (pSVar1 != this_00) {
          this_00 = this_00 + -1;
          SimpleTag::~SimpleTag(this_00);
        }
        operator_delete__(&pSVar1[-1].m_tag_string);
      }
      *in_RDI = (long)local_78;
      *(int *)(in_RDI + 1) = local_6c;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Tags::Tag::ExpandSimpleTagsArray() {
  if (m_simple_tags_size > m_simple_tags_count)
    return true;  // nothing else to do

  const int size = (m_simple_tags_size == 0) ? 1 : 2 * m_simple_tags_size;

  SimpleTag* const displays = new (std::nothrow) SimpleTag[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_simple_tags_count; ++idx) {
    m_simple_tags[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_simple_tags;
  m_simple_tags = displays;

  m_simple_tags_size = size;
  return true;
}